

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void av1_highbd_dr_prediction_z1_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint16_t uVar4;
  ushort uVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [16];
  int iVar14;
  long lVar15;
  int frac_bits;
  ulong uVar16;
  undefined1 (*pauVar17) [32];
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  uint uVar22;
  int iVar23;
  uint uVar24;
  __m128i a_mbase_x;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  ushort uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar42 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar74 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  int in_stack_fffffffffffff760;
  undefined8 local_860 [262];
  undefined1 auVar28 [32];
  undefined1 auVar33 [32];
  
  uVar19 = (ulong)(uint)bh;
  if (bw < 0x10) {
    bVar6 = (byte)upsample_above;
    if (bw == 4) {
      iVar14 = bh + 3 << (bVar6 & 0x1f);
      uVar4 = above[iVar14];
      auVar27._2_2_ = uVar4;
      auVar27._0_2_ = uVar4;
      auVar27._4_2_ = uVar4;
      auVar27._6_2_ = uVar4;
      auVar27._8_2_ = uVar4;
      auVar27._10_2_ = uVar4;
      auVar27._12_2_ = uVar4;
      auVar27._14_2_ = uVar4;
      if (bd < 0xc) {
        if (0 < bh) {
          auVar54._0_2_ = (undefined2)iVar14;
          auVar54._2_2_ = auVar54._0_2_;
          auVar54._4_2_ = auVar54._0_2_;
          auVar54._6_2_ = auVar54._0_2_;
          auVar54._8_2_ = auVar54._0_2_;
          auVar54._10_2_ = auVar54._0_2_;
          auVar54._12_2_ = auVar54._0_2_;
          auVar54._14_2_ = auVar54._0_2_;
          pauVar21 = (undefined1 (*) [16])local_860;
          uVar18 = 0;
          auVar84._8_2_ = 0x10;
          auVar84._0_8_ = 0x10001000100010;
          auVar84._10_2_ = 0x10;
          auVar84._12_2_ = 0x10;
          auVar84._14_2_ = 0x10;
          auVar63._8_2_ = 0x1f;
          auVar63._0_8_ = 0x1f001f001f001f;
          auVar63._10_2_ = 0x1f;
          auVar63._12_2_ = 0x1f;
          auVar63._14_2_ = 0x1f;
          auVar63._16_2_ = 0x1f;
          auVar63._18_2_ = 0x1f;
          auVar63._20_2_ = 0x1f;
          auVar63._22_2_ = 0x1f;
          auVar63._24_2_ = 0x1f;
          auVar63._26_2_ = 0x1f;
          auVar63._28_2_ = 0x1f;
          auVar63._30_2_ = 0x1f;
          uVar20 = uVar19;
          uVar22 = dx;
          do {
            uVar24 = (int)uVar22 >> (6 - bVar6 & 0x1f);
            pauVar13 = pauVar21;
            uVar16 = uVar20;
            if ((int)uVar24 < iVar14) {
              auVar44 = *(undefined1 (*) [16])(above + (int)uVar24);
              auVar51._0_2_ = (undefined2)uVar24;
              if (upsample_above == 0) {
                auVar50 = *(undefined1 (*) [16])(above + (long)(int)uVar24 + 1);
                auVar85._2_2_ = auVar51._0_2_;
                auVar85._0_2_ = auVar51._0_2_;
                auVar85._4_2_ = auVar51._0_2_;
                auVar85._6_2_ = auVar51._0_2_;
                auVar85._8_2_ = auVar51._0_2_;
                auVar85._10_2_ = auVar51._0_2_;
                auVar85._12_2_ = auVar51._0_2_;
                auVar85._14_2_ = auVar51._0_2_;
                auVar73 = vpaddw_avx(auVar85,ZEXT816(0x7000600050004));
                auVar51 = vpinsrw_avx(ZEXT416(uVar24),uVar24 + 1,1);
                auVar51 = vpinsrw_avx(auVar51,uVar24 + 2,2);
                auVar51 = vpinsrw_avx(auVar51,uVar24 + 3,3);
                auVar73 = vpunpcklqdq_avx(auVar51,auVar73);
                uVar5 = (ushort)(uVar22 >> 1);
                uVar38 = uVar5 & 0x1f;
                auVar86._0_8_ =
                     CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5))) & 0x1f001f001f001f;
                auVar86._8_2_ = uVar38;
                auVar86._10_2_ = uVar38;
                auVar86._12_2_ = uVar38;
                auVar86._14_2_ = uVar38;
              }
              else {
                auVar44 = vpshufb_avx(auVar44,_DAT_00510f80);
                auVar50 = vpsrldq_avx(auVar44,8);
                auVar51._2_2_ = auVar51._0_2_;
                auVar51._4_2_ = auVar51._0_2_;
                auVar51._6_2_ = auVar51._0_2_;
                auVar51._8_2_ = auVar51._0_2_;
                auVar51._10_2_ = auVar51._0_2_;
                auVar51._12_2_ = auVar51._0_2_;
                auVar51._14_2_ = auVar51._0_2_;
                auVar73 = vpinsrw_avx(ZEXT416(uVar24),uVar24 + 2,1);
                auVar73 = vpinsrw_avx(auVar73,uVar24 + 4,2);
                auVar86 = vpinsrw_avx(auVar73,uVar24 + 6,3);
                auVar73 = vpaddw_avx(auVar51,ZEXT816(0xe000c000a0008));
                auVar73 = vpunpcklqdq_avx(auVar86,auVar73);
                auVar87._0_2_ = (undefined2)uVar22;
                auVar87._2_2_ = auVar87._0_2_;
                auVar87._4_2_ = auVar87._0_2_;
                auVar87._6_2_ = auVar87._0_2_;
                auVar87._8_2_ = auVar87._0_2_;
                auVar87._10_2_ = auVar87._0_2_;
                auVar87._12_2_ = auVar87._0_2_;
                auVar87._14_2_ = auVar87._0_2_;
                auVar87._16_2_ = auVar87._0_2_;
                auVar87._18_2_ = auVar87._0_2_;
                auVar87._20_2_ = auVar87._0_2_;
                auVar87._22_2_ = auVar87._0_2_;
                auVar87._24_2_ = auVar87._0_2_;
                auVar87._26_2_ = auVar87._0_2_;
                auVar87._28_2_ = auVar87._0_2_;
                auVar87._30_2_ = auVar87._0_2_;
                auVar47 = vpsllw_avx2(auVar87,ZEXT416((uint)upsample_above));
                auVar47 = vpsrlw_avx2(auVar47,1);
                auVar47 = vpand_avx2(auVar47,auVar63);
                auVar86 = auVar47._0_16_;
              }
              auVar73 = vpcmpgtw_avx(auVar54,auVar73);
              auVar50 = vpsubw_avx(auVar50,auVar44);
              auVar50 = vpmullw_avx(auVar50,auVar86);
              auVar44 = vpsllw_avx(auVar44,5);
              auVar44 = vpaddw_avx(auVar44,auVar84);
              auVar44 = vpaddw_avx(auVar50,auVar44);
              auVar44 = vpsrlw_avx(auVar44,5);
              auVar44 = vpblendvb_avx(auVar27,auVar44,auVar73);
              *(undefined1 (*) [16])(local_860 + uVar18 * 2) = auVar44;
              uVar22 = uVar22 + dx;
            }
            else {
              do {
                *pauVar13 = auVar27;
                uVar16 = uVar16 - 1;
                pauVar13 = pauVar13 + 1;
              } while (uVar16 != 0);
            }
            if (iVar14 <= (int)uVar24) break;
            uVar18 = uVar18 + 1;
            uVar20 = uVar20 - 1;
            pauVar21 = pauVar21 + 1;
          } while (uVar18 != uVar19);
        }
      }
      else if (0 < bh) {
        auVar44._4_4_ = iVar14;
        auVar44._0_4_ = iVar14;
        auVar44._8_4_ = iVar14;
        auVar44._12_4_ = iVar14;
        pauVar21 = (undefined1 (*) [16])local_860;
        uVar18 = 0;
        auVar50._8_4_ = 0x10;
        auVar50._0_8_ = 0x1000000010;
        auVar50._12_4_ = 0x10;
        auVar47._8_4_ = 0x1f;
        auVar47._0_8_ = 0x1f0000001f;
        auVar47._12_4_ = 0x1f;
        auVar47._16_4_ = 0x1f;
        auVar47._20_4_ = 0x1f;
        auVar47._24_4_ = 0x1f;
        auVar47._28_4_ = 0x1f;
        uVar20 = uVar19;
        uVar22 = dx;
        do {
          uVar24 = (int)uVar22 >> (6 - bVar6 & 0x1f);
          pauVar13 = pauVar21;
          uVar16 = uVar20;
          if ((int)uVar24 < iVar14) {
            auVar40 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (int)uVar24));
            auVar54 = auVar40._0_16_;
            if (upsample_above == 0) {
              auVar40 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar24 + 1));
              auVar51 = auVar40._0_16_;
              auVar84 = vpinsrd_avx(ZEXT416(uVar24),uVar24 + 1,1);
              auVar84 = vpinsrd_avx(auVar84,uVar24 + 2,2);
              auVar84 = vpinsrd_avx(auVar84,uVar24 + 3,3);
              uVar10 = uVar22 >> 1;
              auVar73._0_8_ = CONCAT44(uVar10,uVar10) & 0x1f0000001f;
              auVar73._8_4_ = uVar10 & 0x1f;
              auVar73._12_4_ = uVar10 & 0x1f;
            }
            else {
              auVar40 = vpshufd_avx2(auVar40,0xd8);
              auVar40 = vpermq_avx2(auVar40,0xd8);
              auVar54 = auVar40._0_16_;
              auVar51 = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar40._16_16_;
              auVar84 = vpinsrd_avx(ZEXT416(uVar24),uVar24 + 2,1);
              auVar84 = vpinsrd_avx(auVar84,uVar24 + 4,2);
              auVar84 = vpinsrd_avx(auVar84,uVar24 + 6,3);
              auVar40._4_4_ = uVar22;
              auVar40._0_4_ = uVar22;
              auVar40._8_4_ = uVar22;
              auVar40._12_4_ = uVar22;
              auVar40._16_4_ = uVar22;
              auVar40._20_4_ = uVar22;
              auVar40._24_4_ = uVar22;
              auVar40._28_4_ = uVar22;
              auVar40 = vpslld_avx2(auVar40,ZEXT416((uint)upsample_above));
              auVar40 = vpsrld_avx2(auVar40,1);
              auVar40 = vpand_avx2(auVar40,auVar47);
              auVar73 = auVar40._0_16_;
            }
            auVar86 = vpcmpgtd_avx(auVar44,auVar84);
            auVar84 = vpsubd_avx(auVar51,auVar54);
            auVar84 = vpmulld_avx(auVar84,auVar73);
            auVar54 = vpslld_avx(auVar54,5);
            auVar54 = vpaddd_avx(auVar54,auVar50);
            auVar54 = vpaddd_avx(auVar84,auVar54);
            auVar54 = vpsrld_avx(auVar54,5);
            auVar84 = vpackusdw_avx(auVar54,auVar54);
            auVar54 = vpackssdw_avx(auVar86,auVar86);
            auVar54 = vpblendvb_avx(auVar27,auVar84,auVar54);
            *(undefined1 (*) [16])(local_860 + uVar18 * 2) = auVar54;
            uVar22 = uVar22 + dx;
          }
          else {
            do {
              *pauVar13 = auVar27;
              uVar16 = uVar16 - 1;
              pauVar13 = pauVar13 + 1;
            } while (uVar16 != 0);
          }
          if (iVar14 <= (int)uVar24) break;
          uVar18 = uVar18 + 1;
          uVar20 = uVar20 - 1;
          pauVar21 = pauVar21 + 1;
        } while (uVar18 != uVar19);
      }
      if (0 < bh) {
        lVar15 = 0;
        do {
          *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar15);
          lVar15 = lVar15 + 0x10;
          dst = dst + stride;
        } while ((ulong)(uint)bh << 4 != lVar15);
      }
    }
    else if (bw == 8) {
      iVar14 = bh + 7 << (bVar6 & 0x1f);
      if (bd < 0xc) {
        if (0 < bh) {
          uVar4 = above[iVar14];
          auVar25._2_2_ = uVar4;
          auVar25._0_2_ = uVar4;
          auVar25._4_2_ = uVar4;
          auVar25._6_2_ = uVar4;
          auVar25._8_2_ = uVar4;
          auVar25._10_2_ = uVar4;
          auVar25._12_2_ = uVar4;
          auVar25._14_2_ = uVar4;
          auVar30._0_2_ = (undefined2)iVar14;
          auVar30._2_2_ = auVar30._0_2_;
          auVar30._4_2_ = auVar30._0_2_;
          auVar30._6_2_ = auVar30._0_2_;
          auVar30._8_2_ = auVar30._0_2_;
          auVar30._10_2_ = auVar30._0_2_;
          auVar30._12_2_ = auVar30._0_2_;
          auVar30._14_2_ = auVar30._0_2_;
          pauVar21 = (undefined1 (*) [16])local_860;
          uVar18 = 0;
          auVar34._8_2_ = 0x10;
          auVar34._0_8_ = 0x10001000100010;
          auVar34._10_2_ = 0x10;
          auVar34._12_2_ = 0x10;
          auVar34._14_2_ = 0x10;
          auVar46._8_2_ = 0x1f;
          auVar46._0_8_ = 0x1f001f001f001f;
          auVar46._10_2_ = 0x1f;
          auVar46._12_2_ = 0x1f;
          auVar46._14_2_ = 0x1f;
          auVar46._16_2_ = 0x1f;
          auVar46._18_2_ = 0x1f;
          auVar46._20_2_ = 0x1f;
          auVar46._22_2_ = 0x1f;
          auVar46._24_2_ = 0x1f;
          auVar46._26_2_ = 0x1f;
          auVar46._28_2_ = 0x1f;
          auVar46._30_2_ = 0x1f;
          uVar20 = uVar19;
          uVar22 = dx;
          do {
            uVar24 = (int)uVar22 >> (6 - bVar6 & 0x1f);
            pauVar13 = pauVar21;
            uVar16 = uVar20;
            if ((int)uVar24 < iVar14) {
              auVar27 = *(undefined1 (*) [16])(above + (int)uVar24);
              if (upsample_above == 0) {
                auVar44 = *(undefined1 (*) [16])(above + (long)(int)uVar24 + 1);
                auVar50 = vpinsrw_avx(ZEXT416(uVar24),uVar24 + 1,1);
                auVar50 = vpinsrw_avx(auVar50,uVar24 + 2,2);
                auVar50 = vpinsrw_avx(auVar50,uVar24 + 3,3);
                auVar50 = vpinsrw_avx(auVar50,uVar24 + 4,4);
                auVar50 = vpinsrw_avx(auVar50,uVar24 + 5,5);
                auVar50 = vpinsrw_avx(auVar50,uVar24 + 6,6);
                auVar50 = vpinsrw_avx(auVar50,uVar24 + 7,7);
                uVar5 = (ushort)(uVar22 >> 1);
                uVar38 = uVar5 & 0x1f;
                auVar74._0_8_ =
                     CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5))) & 0x1f001f001f001f;
                auVar74._8_2_ = uVar38;
                auVar74._10_2_ = uVar38;
                auVar74._12_2_ = uVar38;
                auVar74._14_2_ = uVar38;
              }
              else {
                auVar44 = vpblendw_avx(auVar27,(undefined1  [16])0x0,0xaa);
                auVar50 = vpblendw_avx(*(undefined1 (*) [16])(above + (long)(int)uVar24 + 8),
                                       (undefined1  [16])0x0,0xaa);
                auVar84 = vpsrld_avx(auVar27,0x10);
                auVar27 = vpackusdw_avx(auVar44,auVar50);
                auVar54 = vpsrld_avx(*(undefined1 (*) [16])(above + (long)(int)uVar24 + 8),0x10);
                auVar44 = vpinsrw_avx(ZEXT416(uVar24),uVar24 + 2,1);
                auVar44 = vpinsrw_avx(auVar44,uVar24 + 4,2);
                auVar44 = vpinsrw_avx(auVar44,uVar24 + 6,3);
                auVar44 = vpinsrw_avx(auVar44,uVar24 + 8,4);
                auVar44 = vpinsrw_avx(auVar44,uVar24 + 10,5);
                auVar44 = vpinsrw_avx(auVar44,uVar24 + 0xc,6);
                auVar50 = vpinsrw_avx(auVar44,uVar24 + 0xe,7);
                auVar76._0_2_ = (undefined2)uVar22;
                auVar76._2_2_ = auVar76._0_2_;
                auVar76._4_2_ = auVar76._0_2_;
                auVar76._6_2_ = auVar76._0_2_;
                auVar76._8_2_ = auVar76._0_2_;
                auVar76._10_2_ = auVar76._0_2_;
                auVar76._12_2_ = auVar76._0_2_;
                auVar76._14_2_ = auVar76._0_2_;
                auVar76._16_2_ = auVar76._0_2_;
                auVar76._18_2_ = auVar76._0_2_;
                auVar76._20_2_ = auVar76._0_2_;
                auVar76._22_2_ = auVar76._0_2_;
                auVar76._24_2_ = auVar76._0_2_;
                auVar76._26_2_ = auVar76._0_2_;
                auVar76._28_2_ = auVar76._0_2_;
                auVar76._30_2_ = auVar76._0_2_;
                auVar47 = vpsllw_avx2(auVar76,ZEXT416((uint)upsample_above));
                auVar44 = vpackusdw_avx(auVar84,auVar54);
                auVar47 = vpsrlw_avx2(auVar47,1);
                auVar47 = vpand_avx2(auVar47,auVar46);
                auVar74 = auVar47._0_16_;
              }
              auVar54 = vpsllw_avx(auVar27,5);
              auVar54 = vpaddw_avx(auVar54,auVar34);
              auVar27 = vpsubw_avx(auVar44,auVar27);
              auVar27 = vpmullw_avx(auVar74,auVar27);
              auVar27 = vpaddw_avx(auVar54,auVar27);
              auVar44 = vpsrlw_avx(auVar27,5);
              auVar27 = vpcmpgtw_avx(auVar30,auVar50);
              auVar27 = vpblendvb_avx(auVar25,auVar44,auVar27);
              *(undefined1 (*) [16])(local_860 + uVar18 * 2) = auVar27;
              uVar22 = uVar22 + dx;
            }
            else {
              do {
                *pauVar13 = auVar25;
                uVar16 = uVar16 - 1;
                pauVar13 = pauVar13 + 1;
              } while (uVar16 != 0);
            }
            if (iVar14 <= (int)uVar24) break;
            uVar18 = uVar18 + 1;
            uVar20 = uVar20 - 1;
            pauVar21 = pauVar21 + 1;
          } while (uVar18 != uVar19);
        }
      }
      else if (0 < bh) {
        auVar29._4_4_ = iVar14;
        auVar29._0_4_ = iVar14;
        auVar29._8_4_ = iVar14;
        auVar29._12_4_ = iVar14;
        auVar29._16_4_ = iVar14;
        auVar29._20_4_ = iVar14;
        auVar29._24_4_ = iVar14;
        auVar29._28_4_ = iVar14;
        uVar4 = above[iVar14];
        auVar31._2_2_ = uVar4;
        auVar31._0_2_ = uVar4;
        auVar31._4_2_ = uVar4;
        auVar31._6_2_ = uVar4;
        auVar31._8_2_ = uVar4;
        auVar31._10_2_ = uVar4;
        auVar31._12_2_ = uVar4;
        auVar31._14_2_ = uVar4;
        auVar33._16_2_ = uVar4;
        auVar33._0_16_ = auVar31;
        auVar33._18_2_ = uVar4;
        auVar33._20_2_ = uVar4;
        auVar33._22_2_ = uVar4;
        auVar33._24_2_ = uVar4;
        auVar33._26_2_ = uVar4;
        auVar33._28_2_ = uVar4;
        auVar33._30_2_ = uVar4;
        pauVar21 = (undefined1 (*) [16])local_860;
        uVar18 = 0;
        auVar27 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar37._8_4_ = 0x10;
        auVar37._0_8_ = 0x1000000010;
        auVar37._12_4_ = 0x10;
        auVar37._16_4_ = 0x10;
        auVar37._20_4_ = 0x10;
        auVar37._24_4_ = 0x10;
        auVar37._28_4_ = 0x10;
        auVar44 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar53._8_4_ = 0x1f;
        auVar53._0_8_ = 0x1f0000001f;
        auVar53._12_4_ = 0x1f;
        auVar53._16_4_ = 0x1f;
        auVar53._20_4_ = 0x1f;
        auVar53._24_4_ = 0x1f;
        auVar53._28_4_ = 0x1f;
        uVar20 = uVar19;
        uVar22 = dx;
        do {
          iVar23 = (int)uVar22 >> (6 - bVar6 & 0x1f);
          pauVar13 = pauVar21;
          uVar16 = uVar20;
          if (iVar23 < iVar14) {
            auVar72 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + iVar23));
            if (upsample_above == 0) {
              auVar47 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)iVar23 + 1));
              auVar75._4_4_ = iVar23;
              auVar75._0_4_ = iVar23;
              auVar75._8_4_ = iVar23;
              auVar75._12_4_ = iVar23;
              iVar1 = iVar23 + 5;
              iVar2 = iVar23 + 6;
              iVar3 = iVar23 + 7;
              auVar50 = vpaddd_avx(auVar75,auVar27);
              auVar40 = vpermq_avx2(ZEXT1632(auVar50),0xc4);
              auVar40 = vpblendd_avx2(auVar40,ZEXT1632(auVar75),1);
              auVar80._4_4_ = iVar1;
              auVar80._0_4_ = iVar1;
              auVar80._8_4_ = iVar1;
              auVar80._12_4_ = iVar1;
              auVar80._16_4_ = iVar1;
              auVar80._20_4_ = iVar1;
              auVar80._24_4_ = iVar1;
              auVar80._28_4_ = iVar1;
              auVar40 = vpblendd_avx2(auVar40,auVar80,0x20);
              auVar81._4_4_ = iVar2;
              auVar81._0_4_ = iVar2;
              auVar81._8_4_ = iVar2;
              auVar81._12_4_ = iVar2;
              auVar81._16_4_ = iVar2;
              auVar81._20_4_ = iVar2;
              auVar81._24_4_ = iVar2;
              auVar81._28_4_ = iVar2;
              auVar40 = vpblendd_avx2(auVar40,auVar81,0x40);
              auVar82._4_4_ = iVar3;
              auVar82._0_4_ = iVar3;
              auVar82._8_4_ = iVar3;
              auVar82._12_4_ = iVar3;
              auVar82._16_4_ = iVar3;
              auVar82._20_4_ = iVar3;
              auVar82._24_4_ = iVar3;
              auVar82._28_4_ = iVar3;
              auVar40 = vpblendd_avx2(auVar40,auVar82,0x80);
              uVar24 = uVar22 >> 1;
              uVar10 = uVar24 & 0x1f;
              auVar83._0_8_ = CONCAT44(uVar24,uVar24) & 0x1f0000001f;
              auVar83._8_4_ = uVar10;
              auVar83._12_4_ = uVar10;
              auVar83._16_4_ = uVar10;
              auVar83._20_4_ = uVar10;
              auVar83._24_4_ = uVar10;
              auVar83._28_4_ = uVar10;
            }
            else {
              auVar47 = vpshufd_avx2(auVar72,0xd8);
              auVar63 = vpermq_avx2(auVar47,0xd8);
              auVar47 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)iVar23 + 8));
              auVar47 = vpshufd_avx2(auVar47,0xd8);
              auVar87 = vpermq_avx2(auVar47,0xd8);
              auVar55._4_4_ = iVar23;
              auVar55._0_4_ = iVar23;
              auVar55._8_4_ = iVar23;
              auVar55._12_4_ = iVar23;
              iVar1 = iVar23 + 10;
              iVar2 = iVar23 + 0xc;
              iVar3 = iVar23 + 0xe;
              auVar50 = vpaddd_avx(auVar55,auVar44);
              auVar47 = vpermq_avx2(ZEXT1632(auVar50),0xc4);
              auVar47 = vpblendd_avx2(auVar47,ZEXT1632(auVar55),1);
              auVar77._4_4_ = iVar1;
              auVar77._0_4_ = iVar1;
              auVar77._8_4_ = iVar1;
              auVar77._12_4_ = iVar1;
              auVar77._16_4_ = iVar1;
              auVar77._20_4_ = iVar1;
              auVar77._24_4_ = iVar1;
              auVar77._28_4_ = iVar1;
              auVar47 = vpblendd_avx2(auVar47,auVar77,0x20);
              auVar78._4_4_ = iVar2;
              auVar78._0_4_ = iVar2;
              auVar78._8_4_ = iVar2;
              auVar78._12_4_ = iVar2;
              auVar78._16_4_ = iVar2;
              auVar78._20_4_ = iVar2;
              auVar78._24_4_ = iVar2;
              auVar78._28_4_ = iVar2;
              auVar47 = vpblendd_avx2(auVar47,auVar78,0x40);
              auVar79._4_4_ = iVar3;
              auVar79._0_4_ = iVar3;
              auVar79._8_4_ = iVar3;
              auVar79._12_4_ = iVar3;
              auVar79._16_4_ = iVar3;
              auVar79._20_4_ = iVar3;
              auVar79._24_4_ = iVar3;
              auVar79._28_4_ = iVar3;
              auVar40 = vpblendd_avx2(auVar47,auVar79,0x80);
              auVar71._4_4_ = uVar22;
              auVar71._0_4_ = uVar22;
              auVar71._8_4_ = uVar22;
              auVar71._12_4_ = uVar22;
              auVar71._16_4_ = uVar22;
              auVar71._20_4_ = uVar22;
              auVar71._24_4_ = uVar22;
              auVar71._28_4_ = uVar22;
              auVar47 = vpslld_avx2(auVar71,ZEXT416((uint)upsample_above));
              auVar72._0_16_ = ZEXT116(0) * auVar87._0_16_ + ZEXT116(1) * auVar63._0_16_;
              auVar72._16_16_ = ZEXT116(0) * auVar63._16_16_ + ZEXT116(1) * auVar87._0_16_;
              auVar47 = vpsrld_avx2(auVar47,1);
              auVar83 = vpand_avx2(auVar47,auVar53);
              auVar47 = vperm2i128_avx2(auVar63,auVar87,0x31);
            }
            auVar40 = vpcmpgtd_avx2(auVar29,auVar40);
            auVar47 = vpsubd_avx2(auVar47,auVar72);
            auVar63 = vpmulld_avx2(auVar47,auVar83);
            auVar47 = vpslld_avx2(auVar72,5);
            auVar47 = vpaddd_avx2(auVar47,auVar37);
            auVar47 = vpaddd_avx2(auVar63,auVar47);
            auVar47 = vpsrld_avx2(auVar47,5);
            auVar54 = vpackusdw_avx(auVar47._0_16_,auVar47._16_16_);
            auVar50 = vpackssdw_avx(auVar40._0_16_,auVar40._16_16_);
            auVar47 = vpblendvb_avx2(auVar33,ZEXT1632(auVar54),ZEXT1632(auVar50));
            *(undefined1 (*) [16])(local_860 + uVar18 * 2) = auVar47._0_16_;
            uVar22 = uVar22 + dx;
          }
          else {
            do {
              *pauVar13 = auVar31;
              uVar16 = uVar16 - 1;
              pauVar13 = pauVar13 + 1;
            } while (uVar16 != 0);
          }
          if (iVar14 <= iVar23) break;
          uVar18 = uVar18 + 1;
          uVar20 = uVar20 - 1;
          pauVar21 = pauVar21 + 1;
        } while (uVar18 != uVar19);
      }
      if (0 < bh) {
        lVar15 = 0;
        do {
          uVar7 = *(undefined8 *)((long)local_860 + lVar15 + 8);
          *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar15);
          *(undefined8 *)(dst + 4) = uVar7;
          lVar15 = lVar15 + 0x10;
          dst = dst + stride;
        } while (uVar19 << 4 != lVar15);
      }
    }
  }
  else if (bw == 0x10) {
    uVar4 = above[(long)bh + 0xf];
    auVar26._2_2_ = uVar4;
    auVar26._0_2_ = uVar4;
    auVar26._4_2_ = uVar4;
    auVar26._6_2_ = uVar4;
    auVar26._8_2_ = uVar4;
    auVar26._10_2_ = uVar4;
    auVar26._12_2_ = uVar4;
    auVar26._14_2_ = uVar4;
    auVar28._16_2_ = uVar4;
    auVar28._0_16_ = auVar26;
    auVar28._18_2_ = uVar4;
    auVar28._20_2_ = uVar4;
    auVar28._22_2_ = uVar4;
    auVar28._24_2_ = uVar4;
    auVar28._26_2_ = uVar4;
    auVar28._28_2_ = uVar4;
    auVar28._30_2_ = uVar4;
    iVar14 = bh + 0xf;
    auVar32._0_2_ = (undefined2)iVar14;
    auVar32._2_2_ = auVar32._0_2_;
    auVar32._4_2_ = auVar32._0_2_;
    auVar32._6_2_ = auVar32._0_2_;
    auVar32._8_2_ = auVar32._0_2_;
    auVar32._10_2_ = auVar32._0_2_;
    auVar32._12_2_ = auVar32._0_2_;
    auVar32._14_2_ = auVar32._0_2_;
    auVar32._16_2_ = auVar32._0_2_;
    auVar32._18_2_ = auVar32._0_2_;
    auVar32._20_2_ = auVar32._0_2_;
    auVar32._22_2_ = auVar32._0_2_;
    auVar32._24_2_ = auVar32._0_2_;
    auVar32._26_2_ = auVar32._0_2_;
    auVar32._28_2_ = auVar32._0_2_;
    auVar32._30_2_ = auVar32._0_2_;
    if (bd < 0xc) {
      if (0 < bh) {
        pauVar17 = (undefined1 (*) [32])local_860;
        auVar35._8_2_ = 0x10;
        auVar35._0_8_ = 0x10001000100010;
        auVar35._10_2_ = 0x10;
        auVar35._12_2_ = 0x10;
        auVar35._14_2_ = 0x10;
        auVar35._16_2_ = 0x10;
        auVar35._18_2_ = 0x10;
        auVar35._20_2_ = 0x10;
        auVar35._22_2_ = 0x10;
        auVar35._24_2_ = 0x10;
        auVar35._26_2_ = 0x10;
        auVar35._28_2_ = 0x10;
        auVar35._30_2_ = 0x10;
        uVar18 = 0;
        auVar27 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        uVar20 = uVar19;
        uVar22 = dx;
        do {
          uVar24 = (int)uVar22 >> 6;
          pauVar12 = pauVar17;
          uVar16 = uVar20;
          if ((int)uVar24 < iVar14) {
            uVar5 = (ushort)(uVar22 >> 1);
            uVar38 = uVar5 & 0x1f;
            auVar39._0_8_ = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5))) & 0x1f001f001f001f
            ;
            auVar39._8_2_ = uVar38;
            auVar39._10_2_ = uVar38;
            auVar39._12_2_ = uVar38;
            auVar39._14_2_ = uVar38;
            auVar39._16_2_ = uVar38;
            auVar39._18_2_ = uVar38;
            auVar39._20_2_ = uVar38;
            auVar39._22_2_ = uVar38;
            auVar39._24_2_ = uVar38;
            auVar39._26_2_ = uVar38;
            auVar39._28_2_ = uVar38;
            auVar39._30_2_ = uVar38;
            auVar47 = vpsubw_avx2(*(undefined1 (*) [32])(above + (long)(int)uVar24 + 1),
                                  *(undefined1 (*) [32])(above + (int)uVar24));
            auVar40 = vpmullw_avx2(auVar47,auVar39);
            auVar47 = vpsllw_avx2(*(undefined1 (*) [32])(above + (int)uVar24),5);
            auVar47 = vpaddw_avx2(auVar47,auVar35);
            auVar47 = vpaddw_avx2(auVar40,auVar47);
            auVar40 = vpsrlw_avx2(auVar47,5);
            auVar43._0_2_ = (undefined2)uVar24;
            auVar43._2_2_ = auVar43._0_2_;
            auVar43._4_2_ = auVar43._0_2_;
            auVar43._6_2_ = auVar43._0_2_;
            auVar43._8_2_ = auVar43._0_2_;
            auVar43._10_2_ = auVar43._0_2_;
            auVar43._12_2_ = auVar43._0_2_;
            auVar43._14_2_ = auVar43._0_2_;
            auVar44 = vpaddw_avx(auVar43,auVar27);
            auVar50 = vpslldq_avx(auVar44,2);
            auVar50 = vpblendw_avx(auVar50,ZEXT416(uVar24),1);
            auVar44 = vpsrldq_avx(auVar44,0xe);
            auVar48._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar26;
            auVar48._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar44;
            auVar56._0_2_ = (undefined2)(uVar24 + 9);
            auVar56._2_2_ = auVar56._0_2_;
            auVar56._4_2_ = auVar56._0_2_;
            auVar56._6_2_ = auVar56._0_2_;
            auVar56._8_2_ = auVar56._0_2_;
            auVar56._10_2_ = auVar56._0_2_;
            auVar56._12_2_ = auVar56._0_2_;
            auVar56._14_2_ = auVar56._0_2_;
            auVar56._16_2_ = auVar56._0_2_;
            auVar56._18_2_ = auVar56._0_2_;
            auVar56._20_2_ = auVar56._0_2_;
            auVar56._22_2_ = auVar56._0_2_;
            auVar56._24_2_ = auVar56._0_2_;
            auVar56._26_2_ = auVar56._0_2_;
            auVar56._28_2_ = auVar56._0_2_;
            auVar56._30_2_ = auVar56._0_2_;
            auVar47 = vpblendw_avx2(auVar48,auVar56,2);
            auVar57._0_2_ = (undefined2)(uVar24 + 10);
            auVar57._2_2_ = auVar57._0_2_;
            auVar57._4_2_ = auVar57._0_2_;
            auVar57._6_2_ = auVar57._0_2_;
            auVar57._8_2_ = auVar57._0_2_;
            auVar57._10_2_ = auVar57._0_2_;
            auVar57._12_2_ = auVar57._0_2_;
            auVar57._14_2_ = auVar57._0_2_;
            auVar57._16_2_ = auVar57._0_2_;
            auVar57._18_2_ = auVar57._0_2_;
            auVar57._20_2_ = auVar57._0_2_;
            auVar57._22_2_ = auVar57._0_2_;
            auVar57._24_2_ = auVar57._0_2_;
            auVar57._26_2_ = auVar57._0_2_;
            auVar57._28_2_ = auVar57._0_2_;
            auVar57._30_2_ = auVar57._0_2_;
            auVar47 = vpblendw_avx2(auVar47,auVar57,4);
            auVar58._0_2_ = (undefined2)(uVar24 + 0xb);
            auVar58._2_2_ = auVar58._0_2_;
            auVar58._4_2_ = auVar58._0_2_;
            auVar58._6_2_ = auVar58._0_2_;
            auVar58._8_2_ = auVar58._0_2_;
            auVar58._10_2_ = auVar58._0_2_;
            auVar58._12_2_ = auVar58._0_2_;
            auVar58._14_2_ = auVar58._0_2_;
            auVar58._16_2_ = auVar58._0_2_;
            auVar58._18_2_ = auVar58._0_2_;
            auVar58._20_2_ = auVar58._0_2_;
            auVar58._22_2_ = auVar58._0_2_;
            auVar58._24_2_ = auVar58._0_2_;
            auVar58._26_2_ = auVar58._0_2_;
            auVar58._28_2_ = auVar58._0_2_;
            auVar58._30_2_ = auVar58._0_2_;
            auVar47 = vpblendw_avx2(auVar47,auVar58,8);
            auVar59._0_2_ = (undefined2)(uVar24 + 0xc);
            auVar59._2_2_ = auVar59._0_2_;
            auVar59._4_2_ = auVar59._0_2_;
            auVar59._6_2_ = auVar59._0_2_;
            auVar59._8_2_ = auVar59._0_2_;
            auVar59._10_2_ = auVar59._0_2_;
            auVar59._12_2_ = auVar59._0_2_;
            auVar59._14_2_ = auVar59._0_2_;
            auVar59._16_2_ = auVar59._0_2_;
            auVar59._18_2_ = auVar59._0_2_;
            auVar59._20_2_ = auVar59._0_2_;
            auVar59._22_2_ = auVar59._0_2_;
            auVar59._24_2_ = auVar59._0_2_;
            auVar59._26_2_ = auVar59._0_2_;
            auVar59._28_2_ = auVar59._0_2_;
            auVar59._30_2_ = auVar59._0_2_;
            auVar47 = vpblendw_avx2(auVar47,auVar59,0x10);
            auVar60._0_2_ = (undefined2)(uVar24 + 0xd);
            auVar60._2_2_ = auVar60._0_2_;
            auVar60._4_2_ = auVar60._0_2_;
            auVar60._6_2_ = auVar60._0_2_;
            auVar60._8_2_ = auVar60._0_2_;
            auVar60._10_2_ = auVar60._0_2_;
            auVar60._12_2_ = auVar60._0_2_;
            auVar60._14_2_ = auVar60._0_2_;
            auVar60._16_2_ = auVar60._0_2_;
            auVar60._18_2_ = auVar60._0_2_;
            auVar60._20_2_ = auVar60._0_2_;
            auVar60._22_2_ = auVar60._0_2_;
            auVar60._24_2_ = auVar60._0_2_;
            auVar60._26_2_ = auVar60._0_2_;
            auVar60._28_2_ = auVar60._0_2_;
            auVar60._30_2_ = auVar60._0_2_;
            auVar47 = vpblendw_avx2(auVar47,auVar60,0x20);
            auVar61._0_2_ = (undefined2)(uVar24 + 0xe);
            auVar61._2_2_ = auVar61._0_2_;
            auVar61._4_2_ = auVar61._0_2_;
            auVar61._6_2_ = auVar61._0_2_;
            auVar61._8_2_ = auVar61._0_2_;
            auVar61._10_2_ = auVar61._0_2_;
            auVar61._12_2_ = auVar61._0_2_;
            auVar61._14_2_ = auVar61._0_2_;
            auVar61._16_2_ = auVar61._0_2_;
            auVar61._18_2_ = auVar61._0_2_;
            auVar61._20_2_ = auVar61._0_2_;
            auVar61._22_2_ = auVar61._0_2_;
            auVar61._24_2_ = auVar61._0_2_;
            auVar61._26_2_ = auVar61._0_2_;
            auVar61._28_2_ = auVar61._0_2_;
            auVar61._30_2_ = auVar61._0_2_;
            auVar47 = vpblendw_avx2(auVar47,auVar61,0x40);
            auVar62._0_2_ = (undefined2)(uVar24 + 0xf);
            auVar62._2_2_ = auVar62._0_2_;
            auVar62._4_2_ = auVar62._0_2_;
            auVar62._6_2_ = auVar62._0_2_;
            auVar62._8_2_ = auVar62._0_2_;
            auVar62._10_2_ = auVar62._0_2_;
            auVar62._12_2_ = auVar62._0_2_;
            auVar62._14_2_ = auVar62._0_2_;
            auVar62._16_2_ = auVar62._0_2_;
            auVar62._18_2_ = auVar62._0_2_;
            auVar62._20_2_ = auVar62._0_2_;
            auVar62._22_2_ = auVar62._0_2_;
            auVar62._24_2_ = auVar62._0_2_;
            auVar62._26_2_ = auVar62._0_2_;
            auVar62._28_2_ = auVar62._0_2_;
            auVar62._30_2_ = auVar62._0_2_;
            auVar47 = vpblendw_avx2(auVar47,auVar62,0x80);
            auVar47 = vpblendd_avx2(ZEXT1632(auVar50),auVar47,0xf0);
            auVar47 = vpcmpgtw_avx2(auVar32,auVar47);
            auVar47 = vpblendvb_avx2(auVar28,auVar40,auVar47);
            *(undefined1 (*) [32])(local_860 + uVar18 * 4) = auVar47;
            uVar22 = uVar22 + dx;
          }
          else {
            do {
              *pauVar12 = auVar28;
              uVar16 = uVar16 - 1;
              pauVar12 = pauVar12 + 1;
            } while (uVar16 != 0);
          }
          if (iVar14 <= (int)uVar24) break;
          uVar18 = uVar18 + 1;
          uVar20 = uVar20 - 1;
          pauVar17 = pauVar17 + 1;
        } while (uVar18 != uVar19);
      }
    }
    else if (0 < bh) {
      pauVar17 = (undefined1 (*) [32])local_860;
      auVar36._8_4_ = 0x10;
      auVar36._0_8_ = 0x1000000010;
      auVar36._12_4_ = 0x10;
      auVar36._16_4_ = 0x10;
      auVar36._20_4_ = 0x10;
      auVar36._24_4_ = 0x10;
      auVar36._28_4_ = 0x10;
      uVar18 = 0;
      auVar27 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
      uVar20 = uVar19;
      uVar22 = dx;
      do {
        uVar24 = (int)uVar22 >> 6;
        pauVar12 = pauVar17;
        uVar16 = uVar20;
        if ((int)uVar24 < iVar14) {
          uVar10 = uVar22 >> 1;
          uVar11 = uVar10 & 0x1f;
          auVar41._0_8_ = CONCAT44(uVar10,uVar10) & 0x1f0000001f;
          auVar41._8_4_ = uVar11;
          auVar41._12_4_ = uVar11;
          auVar41._16_4_ = uVar11;
          auVar41._20_4_ = uVar11;
          auVar41._24_4_ = uVar11;
          auVar41._28_4_ = uVar11;
          auVar44 = auVar26;
          if ((int)uVar24 < bh + 7) {
            auVar47 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar24 + 8));
            auVar40 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar24 + 9));
            auVar40 = vpsubd_avx2(auVar40,auVar47);
            auVar47 = vpslld_avx2(auVar47,5);
            auVar40 = vpmulld_avx2(auVar40,auVar41);
            auVar47 = vpaddd_avx2(auVar47,auVar36);
            auVar47 = vpaddd_avx2(auVar40,auVar47);
            auVar47 = vpsrld_avx2(auVar47,5);
            auVar52._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar47._16_16_;
            auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
            auVar47 = vpackusdw_avx2(auVar47,auVar52);
            auVar44 = auVar47._0_16_;
          }
          auVar47 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (int)uVar24));
          auVar40 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar24 + 1));
          auVar40 = vpsubd_avx2(auVar40,auVar47);
          auVar47 = vpslld_avx2(auVar47,5);
          auVar40 = vpmulld_avx2(auVar40,auVar41);
          auVar47 = vpaddd_avx2(auVar47,auVar36);
          auVar47 = vpaddd_avx2(auVar40,auVar47);
          auVar47 = vpsrld_avx2(auVar47,5);
          auVar47 = vpackusdw_avx2(auVar47,ZEXT1632(auVar47._16_16_));
          auVar42._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar47._0_16_;
          auVar42._16_16_ = ZEXT116(0) * auVar47._16_16_ + ZEXT116(1) * auVar44;
          auVar45._0_2_ = (undefined2)uVar24;
          auVar45._2_2_ = auVar45._0_2_;
          auVar45._4_2_ = auVar45._0_2_;
          auVar45._6_2_ = auVar45._0_2_;
          auVar45._8_2_ = auVar45._0_2_;
          auVar45._10_2_ = auVar45._0_2_;
          auVar45._12_2_ = auVar45._0_2_;
          auVar45._14_2_ = auVar45._0_2_;
          auVar44 = vpaddw_avx(auVar45,auVar27);
          auVar50 = vpslldq_avx(auVar44,2);
          auVar50 = vpblendw_avx(auVar50,ZEXT416(uVar24),1);
          auVar44 = vpsrldq_avx(auVar44,0xe);
          auVar49._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar26;
          auVar49._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar44;
          auVar64._0_2_ = (undefined2)(uVar24 + 9);
          auVar64._2_2_ = auVar64._0_2_;
          auVar64._4_2_ = auVar64._0_2_;
          auVar64._6_2_ = auVar64._0_2_;
          auVar64._8_2_ = auVar64._0_2_;
          auVar64._10_2_ = auVar64._0_2_;
          auVar64._12_2_ = auVar64._0_2_;
          auVar64._14_2_ = auVar64._0_2_;
          auVar64._16_2_ = auVar64._0_2_;
          auVar64._18_2_ = auVar64._0_2_;
          auVar64._20_2_ = auVar64._0_2_;
          auVar64._22_2_ = auVar64._0_2_;
          auVar64._24_2_ = auVar64._0_2_;
          auVar64._26_2_ = auVar64._0_2_;
          auVar64._28_2_ = auVar64._0_2_;
          auVar64._30_2_ = auVar64._0_2_;
          auVar47 = vpblendw_avx2(auVar49,auVar64,2);
          auVar65._0_2_ = (undefined2)(uVar24 + 10);
          auVar65._2_2_ = auVar65._0_2_;
          auVar65._4_2_ = auVar65._0_2_;
          auVar65._6_2_ = auVar65._0_2_;
          auVar65._8_2_ = auVar65._0_2_;
          auVar65._10_2_ = auVar65._0_2_;
          auVar65._12_2_ = auVar65._0_2_;
          auVar65._14_2_ = auVar65._0_2_;
          auVar65._16_2_ = auVar65._0_2_;
          auVar65._18_2_ = auVar65._0_2_;
          auVar65._20_2_ = auVar65._0_2_;
          auVar65._22_2_ = auVar65._0_2_;
          auVar65._24_2_ = auVar65._0_2_;
          auVar65._26_2_ = auVar65._0_2_;
          auVar65._28_2_ = auVar65._0_2_;
          auVar65._30_2_ = auVar65._0_2_;
          auVar47 = vpblendw_avx2(auVar47,auVar65,4);
          auVar66._0_2_ = (undefined2)(uVar24 + 0xb);
          auVar66._2_2_ = auVar66._0_2_;
          auVar66._4_2_ = auVar66._0_2_;
          auVar66._6_2_ = auVar66._0_2_;
          auVar66._8_2_ = auVar66._0_2_;
          auVar66._10_2_ = auVar66._0_2_;
          auVar66._12_2_ = auVar66._0_2_;
          auVar66._14_2_ = auVar66._0_2_;
          auVar66._16_2_ = auVar66._0_2_;
          auVar66._18_2_ = auVar66._0_2_;
          auVar66._20_2_ = auVar66._0_2_;
          auVar66._22_2_ = auVar66._0_2_;
          auVar66._24_2_ = auVar66._0_2_;
          auVar66._26_2_ = auVar66._0_2_;
          auVar66._28_2_ = auVar66._0_2_;
          auVar66._30_2_ = auVar66._0_2_;
          auVar47 = vpblendw_avx2(auVar47,auVar66,8);
          auVar67._0_2_ = (undefined2)(uVar24 + 0xc);
          auVar67._2_2_ = auVar67._0_2_;
          auVar67._4_2_ = auVar67._0_2_;
          auVar67._6_2_ = auVar67._0_2_;
          auVar67._8_2_ = auVar67._0_2_;
          auVar67._10_2_ = auVar67._0_2_;
          auVar67._12_2_ = auVar67._0_2_;
          auVar67._14_2_ = auVar67._0_2_;
          auVar67._16_2_ = auVar67._0_2_;
          auVar67._18_2_ = auVar67._0_2_;
          auVar67._20_2_ = auVar67._0_2_;
          auVar67._22_2_ = auVar67._0_2_;
          auVar67._24_2_ = auVar67._0_2_;
          auVar67._26_2_ = auVar67._0_2_;
          auVar67._28_2_ = auVar67._0_2_;
          auVar67._30_2_ = auVar67._0_2_;
          auVar47 = vpblendw_avx2(auVar47,auVar67,0x10);
          auVar68._0_2_ = (undefined2)(uVar24 + 0xd);
          auVar68._2_2_ = auVar68._0_2_;
          auVar68._4_2_ = auVar68._0_2_;
          auVar68._6_2_ = auVar68._0_2_;
          auVar68._8_2_ = auVar68._0_2_;
          auVar68._10_2_ = auVar68._0_2_;
          auVar68._12_2_ = auVar68._0_2_;
          auVar68._14_2_ = auVar68._0_2_;
          auVar68._16_2_ = auVar68._0_2_;
          auVar68._18_2_ = auVar68._0_2_;
          auVar68._20_2_ = auVar68._0_2_;
          auVar68._22_2_ = auVar68._0_2_;
          auVar68._24_2_ = auVar68._0_2_;
          auVar68._26_2_ = auVar68._0_2_;
          auVar68._28_2_ = auVar68._0_2_;
          auVar68._30_2_ = auVar68._0_2_;
          auVar47 = vpblendw_avx2(auVar47,auVar68,0x20);
          auVar69._0_2_ = (undefined2)(uVar24 + 0xe);
          auVar69._2_2_ = auVar69._0_2_;
          auVar69._4_2_ = auVar69._0_2_;
          auVar69._6_2_ = auVar69._0_2_;
          auVar69._8_2_ = auVar69._0_2_;
          auVar69._10_2_ = auVar69._0_2_;
          auVar69._12_2_ = auVar69._0_2_;
          auVar69._14_2_ = auVar69._0_2_;
          auVar69._16_2_ = auVar69._0_2_;
          auVar69._18_2_ = auVar69._0_2_;
          auVar69._20_2_ = auVar69._0_2_;
          auVar69._22_2_ = auVar69._0_2_;
          auVar69._24_2_ = auVar69._0_2_;
          auVar69._26_2_ = auVar69._0_2_;
          auVar69._28_2_ = auVar69._0_2_;
          auVar69._30_2_ = auVar69._0_2_;
          auVar47 = vpblendw_avx2(auVar47,auVar69,0x40);
          auVar70._0_2_ = (undefined2)(uVar24 + 0xf);
          auVar70._2_2_ = auVar70._0_2_;
          auVar70._4_2_ = auVar70._0_2_;
          auVar70._6_2_ = auVar70._0_2_;
          auVar70._8_2_ = auVar70._0_2_;
          auVar70._10_2_ = auVar70._0_2_;
          auVar70._12_2_ = auVar70._0_2_;
          auVar70._14_2_ = auVar70._0_2_;
          auVar70._16_2_ = auVar70._0_2_;
          auVar70._18_2_ = auVar70._0_2_;
          auVar70._20_2_ = auVar70._0_2_;
          auVar70._22_2_ = auVar70._0_2_;
          auVar70._24_2_ = auVar70._0_2_;
          auVar70._26_2_ = auVar70._0_2_;
          auVar70._28_2_ = auVar70._0_2_;
          auVar70._30_2_ = auVar70._0_2_;
          auVar47 = vpblendw_avx2(auVar47,auVar70,0x80);
          auVar47 = vpblendd_avx2(ZEXT1632(auVar50),auVar47,0xf0);
          auVar47 = vpcmpgtw_avx2(auVar32,auVar47);
          auVar47 = vpblendvb_avx2(auVar28,auVar42,auVar47);
          *(undefined1 (*) [32])(local_860 + uVar18 * 4) = auVar47;
          uVar22 = uVar22 + dx;
        }
        else {
          do {
            *pauVar12 = auVar28;
            uVar16 = uVar16 - 1;
            pauVar12 = pauVar12 + 1;
          } while (uVar16 != 0);
        }
        if (iVar14 <= (int)uVar24) break;
        uVar18 = uVar18 + 1;
        uVar20 = uVar20 - 1;
        pauVar17 = pauVar17 + 1;
      } while (uVar18 != uVar19);
    }
    if (0 < bh) {
      lVar15 = 0;
      do {
        uVar7 = *(undefined8 *)((long)local_860 + lVar15 + 8);
        uVar8 = *(undefined8 *)((long)local_860 + lVar15 + 0x10);
        uVar9 = *(undefined8 *)((long)local_860 + lVar15 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar15);
        *(undefined8 *)(dst + 4) = uVar7;
        *(undefined8 *)(dst + 8) = uVar8;
        *(undefined8 *)(dst + 0xc) = uVar9;
        lVar15 = lVar15 + 0x20;
        dst = dst + stride;
      } while (uVar19 << 5 != lVar15);
    }
  }
  else if (bw == 0x20) {
    highbd_dr_prediction_z1_32xN_avx2(bh,dst,stride,above,dx,bd,in_stack_fffffffffffff760);
  }
  else if (bw == 0x40) {
    if (bd < 0xc) {
      highbd_dr_prediction_z1_64xN_avx2(bh,dst,stride,above,dx,bd);
    }
    else {
      highbd_dr_prediction_32bit_z1_64xN_avx2(bh,dst,stride,above,dx,bd);
    }
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z1_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int dx, int dy, int bd) {
  (void)left;
  (void)dy;

  switch (bw) {
    case 4:
      highbd_dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 8:
      highbd_dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 16:
      highbd_dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 32:
      highbd_dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 64:
      if (bd < 12) {
        highbd_dr_prediction_z1_64xN_avx2(bh, dst, stride, above,
                                          upsample_above, dx);
      } else {
        highbd_dr_prediction_32bit_z1_64xN_avx2(bh, dst, stride, above,
                                                upsample_above, dx);
      }
      break;
    default: break;
  }
  return;
}